

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O3

AmrMesh * __thiscall amrex::AmrMesh::operator=(AmrMesh *this,AmrMesh *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pDVar8;
  pointer pBVar9;
  bool bVar10;
  undefined2 uVar11;
  uint uVar12;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_38;
  
  iVar3 = (rhs->super_AmrInfo).max_level;
  (this->super_AmrInfo).verbose = (rhs->super_AmrInfo).verbose;
  (this->super_AmrInfo).max_level = iVar3;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::_M_move_assign
            (&(this->super_AmrInfo).ref_ratio.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             &(rhs->super_AmrInfo).ref_ratio);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::_M_move_assign
            (&(this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             &(rhs->super_AmrInfo).blocking_factor);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::_M_move_assign
            (&(this->super_AmrInfo).max_grid_size.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             &(rhs->super_AmrInfo).max_grid_size);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::_M_move_assign
            (&(this->super_AmrInfo).n_error_buf.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             &(rhs->super_AmrInfo).n_error_buf);
  *(undefined4 *)((long)(this->super_AmrInfo).refine_grid_layout_dims.vect + 0xb) =
       *(undefined4 *)((long)(rhs->super_AmrInfo).refine_grid_layout_dims.vect + 0xb);
  uVar1 = *(undefined4 *)&(rhs->super_AmrInfo).grid_eff;
  uVar2 = *(undefined4 *)((long)&(rhs->super_AmrInfo).grid_eff + 4);
  iVar3 = (rhs->super_AmrInfo).n_proper;
  iVar4 = (rhs->super_AmrInfo).use_fixed_upto_level;
  bVar10 = (rhs->super_AmrInfo).refine_grid_layout;
  uVar11 = *(undefined2 *)&(rhs->super_AmrInfo).field_0x7a;
  iVar5 = (rhs->super_AmrInfo).refine_grid_layout_dims.vect[0];
  iVar6 = (rhs->super_AmrInfo).refine_grid_layout_dims.vect[1];
  iVar7 = (rhs->super_AmrInfo).refine_grid_layout_dims.vect[2];
  (this->super_AmrInfo).use_fixed_coarse_grids = (rhs->super_AmrInfo).use_fixed_coarse_grids;
  (this->super_AmrInfo).refine_grid_layout = bVar10;
  *(undefined2 *)&(this->super_AmrInfo).field_0x7a = uVar11;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[0] = iVar5;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[1] = iVar6;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[2] = iVar7;
  *(undefined4 *)&(this->super_AmrInfo).grid_eff = uVar1;
  *(undefined4 *)((long)&(this->super_AmrInfo).grid_eff + 4) = uVar2;
  (this->super_AmrInfo).n_proper = iVar3;
  (this->super_AmrInfo).use_fixed_upto_level = iVar4;
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = *(undefined4 *)&(rhs->super_AmrInfo).field_0x8c
  ;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::_M_move_assign
            (&(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
             &rhs->geom);
  local_38.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->dmap).
                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                .
                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pDVar8 = (rhs->dmap).
           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->dmap).
                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                .
                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->dmap).
                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                .
                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (rhs->dmap).
       super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = pDVar8;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (rhs->dmap).
       super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (rhs->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_38);
  local_38.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pBVar9 = (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar9;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_38);
  uVar12 = rhs->num_setba;
  this->num_setdm = rhs->num_setdm;
  this->num_setba = uVar12;
  return this;
}

Assistant:

AmrMesh& operator= (AmrMesh&& rhs) = default;